

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backoff.c
# Opt level: O3

void nn_backoff_start(nn_backoff *self)

{
  int iVar1;
  int timeout;
  
  iVar1 = self->maxivl;
  timeout = (self->n + -1) * self->minivl;
  if (timeout <= iVar1) {
    self->n = self->n * 2;
    nn_timer_start(&self->timer,timeout);
    return;
  }
  if (-1 < iVar1) {
    (self->timer).timeout = iVar1;
    nn_fsm_start((nn_fsm *)self);
    return;
  }
  nn_timer_start_cold_1();
}

Assistant:

void nn_backoff_start (struct nn_backoff *self)
{
     int timeout;

     /*  Start the timer for the actual n value. If the interval haven't yet
         exceeded the maximum, double the next timeout value. */
     timeout = (self->n - 1) * self->minivl;
     if (timeout > self->maxivl)
         timeout = self->maxivl;
     else
         self->n *= 2;
     nn_timer_start (&self->timer, timeout);
}